

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

bool IsIdentChar(char c)

{
  byte bVar1;
  
  bVar1 = 1;
  if ((0xe < (byte)(c - 0x2bU)) && (0x19 < (byte)((c & 0xdfU) + 0xbf))) {
    if ((byte)(c - 0x20U) < 0x40) {
      bVar1 = (byte)(0x9000000004000011 >> (c - 0x20U & 0x3f));
    }
    else {
      bVar1 = 0;
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

static bool IsIdentChar(char c)
{
  return
    ('a' <= c && c <= 'z') ||
    ('+' <= c && c <= '9') ||  // +,-./ and numbers
    ('A' <= c && c <= 'Z') ||
    (c == '_') || (c == '$') || (c == '\\') ||
    (c == ' ') || (c == ':');
}